

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseOffsetOpt(WastParser *this,Address *out_offset)

{
  Location loc;
  TokenType TVar1;
  Result RVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  uint64_t offset64;
  Token token;
  undefined4 local_70;
  int iStack_6c;
  Token local_68;
  
  TVar1 = Peek(this,0);
  if (TVar1 == OffsetEqNat) {
    Consume(&local_68,this);
    if (5 < local_68.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                    ,0x62,"string_view wabt::Token::text() const");
    }
    RVar2 = ParseInt64(local_68.field_2.text_.data_,
                       local_68.field_2.text_.data_ + (long)local_68.field_2.literal_.text.data_,
                       (uint64_t *)&local_70,SignedAndUnsigned);
    if (RVar2.enum_ == Error) {
      loc.filename.data_._4_4_ = local_68.loc.filename.data_._4_4_;
      loc.filename.data_._0_4_ = local_68.loc.filename.data_._0_4_;
      loc.filename.size_._0_4_ = (undefined4)local_68.loc.filename.size_;
      loc.filename.size_._4_4_ = local_68.loc.filename.size_._4_4_;
      loc.field_1.field_0.line = local_68.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = local_68.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = local_68.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = local_68.loc.field_1._12_4_;
      Error(this,loc,"invalid offset \"%.*s\"",local_68.field_2.text_.size_ & 0xffffffff,
            local_68.field_2.text_.data_,in_R8,in_R9);
    }
    if (iStack_6c != 0) {
      Error(this,0x19fa7f);
    }
    *out_offset = CONCAT44(iStack_6c,local_70);
  }
  else {
    *out_offset = 0;
  }
  return TVar1 == OffsetEqNat;
}

Assistant:

bool WastParser::ParseOffsetOpt(Address* out_offset) {
  WABT_TRACE(ParseOffsetOpt);
  if (PeekMatch(TokenType::OffsetEqNat)) {
    Token token = Consume();
    uint64_t offset64;
    string_view sv = token.text();
    if (Failed(ParseInt64(sv.begin(), sv.end(), &offset64,
                          ParseIntType::SignedAndUnsigned))) {
      Error(token.loc, "invalid offset \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }
    // FIXME: make this depend on the current memory.
    if (offset64 > UINT32_MAX) {
      Error(token.loc, "offset must be less than or equal to 0xffffffff");
    }
    *out_offset = offset64;
    return true;
  } else {
    *out_offset = 0;
    return false;
  }
}